

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O2

void pdqsort_detail::
     pdqsort_loop<__gnu_cxx::__normal_iterator<HighsGFkSolve::SolutionEntry*,std::vector<HighsGFkSolve::SolutionEntry,std::allocator<HighsGFkSolve::SolutionEntry>>>,std::less<HighsGFkSolve::SolutionEntry>,false>
               (SolutionEntry *begin,long end,int param_3,uint param_4)

{
  SolutionEntry SVar1;
  undefined8 uVar2;
  bool bVar3;
  __normal_iterator<HighsGFkSolve::SolutionEntry_*,_std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>_>
  _Var4;
  ulong uVar5;
  ulong uVar6;
  undefined8 *puVar7;
  ulong uVar8;
  SolutionEntry *pSVar9;
  SolutionEntry *pSVar10;
  pair<__gnu_cxx::__normal_iterator<HighsGFkSolve::SolutionEntry_*,_std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>_>,_bool>
  pVar11;
  int local_50;
  uint local_4c;
  
  local_4c = param_4;
  local_50 = param_3;
  do {
    while( true ) {
      uVar6 = end - (long)begin >> 3;
      if ((long)uVar6 < 0x18) {
        if ((local_4c & 1) == 0) {
          unguarded_insertion_sort<__gnu_cxx::__normal_iterator<HighsGFkSolve::SolutionEntry*,std::vector<HighsGFkSolve::SolutionEntry,std::allocator<HighsGFkSolve::SolutionEntry>>>,std::less<HighsGFkSolve::SolutionEntry>>
                    (begin,end);
          return;
        }
        insertion_sort<__gnu_cxx::__normal_iterator<HighsGFkSolve::SolutionEntry*,std::vector<HighsGFkSolve::SolutionEntry,std::allocator<HighsGFkSolve::SolutionEntry>>>,std::less<HighsGFkSolve::SolutionEntry>>
                  (begin,end);
        return;
      }
      uVar8 = uVar6 >> 1;
      pSVar10 = begin + uVar8;
      if (uVar6 < 0x81) {
        sort3<__gnu_cxx::__normal_iterator<HighsGFkSolve::SolutionEntry*,std::vector<HighsGFkSolve::SolutionEntry,std::allocator<HighsGFkSolve::SolutionEntry>>>,std::less<HighsGFkSolve::SolutionEntry>>
                  (pSVar10,begin,end + -8);
      }
      else {
        sort3<__gnu_cxx::__normal_iterator<HighsGFkSolve::SolutionEntry*,std::vector<HighsGFkSolve::SolutionEntry,std::allocator<HighsGFkSolve::SolutionEntry>>>,std::less<HighsGFkSolve::SolutionEntry>>
                  (begin,pSVar10,end + -8);
        sort3<__gnu_cxx::__normal_iterator<HighsGFkSolve::SolutionEntry*,std::vector<HighsGFkSolve::SolutionEntry,std::allocator<HighsGFkSolve::SolutionEntry>>>,std::less<HighsGFkSolve::SolutionEntry>>
                  (begin + 1,begin + (uVar8 - 1),end + -0x10);
        pSVar9 = begin + uVar8 + 1;
        sort3<__gnu_cxx::__normal_iterator<HighsGFkSolve::SolutionEntry*,std::vector<HighsGFkSolve::SolutionEntry,std::allocator<HighsGFkSolve::SolutionEntry>>>,std::less<HighsGFkSolve::SolutionEntry>>
                  (begin + 2,pSVar9,end + -0x18);
        sort3<__gnu_cxx::__normal_iterator<HighsGFkSolve::SolutionEntry*,std::vector<HighsGFkSolve::SolutionEntry,std::allocator<HighsGFkSolve::SolutionEntry>>>,std::less<HighsGFkSolve::SolutionEntry>>
                  (begin + (uVar8 - 1),pSVar10,pSVar9);
        SVar1 = *begin;
        *begin = pSVar9[-1];
        pSVar9[-1] = SVar1;
      }
      if (((local_4c & 1) != 0) || (begin[-1].index < begin->index)) break;
      _Var4 = partition_left<__gnu_cxx::__normal_iterator<HighsGFkSolve::SolutionEntry*,std::vector<HighsGFkSolve::SolutionEntry,std::allocator<HighsGFkSolve::SolutionEntry>>>,std::less<HighsGFkSolve::SolutionEntry>>
                        (begin,end);
      begin = _Var4._M_current + 1;
    }
    pVar11 = partition_right<__gnu_cxx::__normal_iterator<HighsGFkSolve::SolutionEntry*,std::vector<HighsGFkSolve::SolutionEntry,std::allocator<HighsGFkSolve::SolutionEntry>>>,std::less<HighsGFkSolve::SolutionEntry>>
                       (begin,end);
    _Var4 = pVar11.first._M_current;
    uVar5 = (long)_Var4._M_current - (long)begin >> 3;
    pSVar10 = _Var4._M_current + 1;
    uVar8 = end - (long)pSVar10 >> 3;
    if (((long)uVar5 < (long)(uVar6 >> 3)) || ((long)uVar8 < (long)(uVar6 >> 3))) {
      local_50 = local_50 + -1;
      if (local_50 == 0) {
        std::
        make_heap<__gnu_cxx::__normal_iterator<HighsGFkSolve::SolutionEntry*,std::vector<HighsGFkSolve::SolutionEntry,std::allocator<HighsGFkSolve::SolutionEntry>>>,std::less<HighsGFkSolve::SolutionEntry>>
                  (begin,end);
        std::
        sort_heap<__gnu_cxx::__normal_iterator<HighsGFkSolve::SolutionEntry*,std::vector<HighsGFkSolve::SolutionEntry,std::allocator<HighsGFkSolve::SolutionEntry>>>,std::less<HighsGFkSolve::SolutionEntry>>
                  (begin,end);
        return;
      }
      if (0x17 < (long)uVar5) {
        uVar6 = uVar5 >> 2;
        SVar1 = *begin;
        *begin = begin[uVar6];
        begin[uVar6] = SVar1;
        SVar1 = _Var4._M_current[-1];
        _Var4._M_current[-1] = _Var4._M_current[-uVar6];
        _Var4._M_current[-uVar6] = SVar1;
        if (0x80 < uVar5) {
          SVar1 = begin[1];
          begin[1] = begin[uVar6 + 1];
          begin[uVar6 + 1] = SVar1;
          SVar1 = begin[2];
          begin[2] = begin[uVar6 + 2];
          begin[uVar6 + 2] = SVar1;
          SVar1 = _Var4._M_current[-2];
          _Var4._M_current[-2] = _Var4._M_current[~uVar6];
          _Var4._M_current[~uVar6] = SVar1;
          SVar1 = _Var4._M_current[-3];
          _Var4._M_current[-3] = _Var4._M_current[-2 - uVar6];
          _Var4._M_current[-2 - uVar6] = SVar1;
        }
      }
      if (0x17 < (long)uVar8) {
        uVar6 = uVar8 >> 2;
        SVar1 = _Var4._M_current[1];
        _Var4._M_current[1] = _Var4._M_current[uVar6 + 1];
        _Var4._M_current[uVar6 + 1] = SVar1;
        puVar7 = (undefined8 *)(end + uVar6 * -8);
        uVar2 = *(undefined8 *)(end + -8);
        *(undefined8 *)(end + -8) = *puVar7;
        *puVar7 = uVar2;
        if (0x80 < uVar8) {
          SVar1 = _Var4._M_current[2];
          _Var4._M_current[2] = _Var4._M_current[uVar6 + 2];
          _Var4._M_current[uVar6 + 2] = SVar1;
          SVar1 = _Var4._M_current[3];
          _Var4._M_current[3] = _Var4._M_current[uVar6 + 3];
          _Var4._M_current[uVar6 + 3] = SVar1;
          uVar2 = *(undefined8 *)(end + -0x10);
          *(undefined8 *)(end + -0x10) = *(undefined8 *)(end + ~uVar6 * 8);
          *(undefined8 *)(end + ~uVar6 * 8) = uVar2;
          uVar2 = *(undefined8 *)(end + -0x18);
          *(undefined8 *)(end + -0x18) = *(undefined8 *)(end + (-2 - uVar6) * 8);
          *(undefined8 *)(end + (-2 - uVar6) * 8) = uVar2;
        }
      }
    }
    else if (((((undefined1  [16])pVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) &&
             (bVar3 = partial_insertion_sort<__gnu_cxx::__normal_iterator<HighsGFkSolve::SolutionEntry*,std::vector<HighsGFkSolve::SolutionEntry,std::allocator<HighsGFkSolve::SolutionEntry>>>,std::less<HighsGFkSolve::SolutionEntry>>
                                (begin,_Var4._M_current), bVar3)) &&
            (bVar3 = partial_insertion_sort<__gnu_cxx::__normal_iterator<HighsGFkSolve::SolutionEntry*,std::vector<HighsGFkSolve::SolutionEntry,std::allocator<HighsGFkSolve::SolutionEntry>>>,std::less<HighsGFkSolve::SolutionEntry>>
                               (pSVar10,end), bVar3)) {
      return;
    }
    pdqsort_loop<__gnu_cxx::__normal_iterator<HighsGFkSolve::SolutionEntry*,std::vector<HighsGFkSolve::SolutionEntry,std::allocator<HighsGFkSolve::SolutionEntry>>>,std::less<HighsGFkSolve::SolutionEntry>,false>
              (begin,_Var4._M_current,local_50,local_4c & 1);
    local_4c = 0;
    begin = pSVar10;
  } while( true );
}

Assistant:

inline void pdqsort_loop(Iter begin, Iter end, Compare comp, int bad_allowed, bool leftmost = true) {
        typedef typename std::iterator_traits<Iter>::difference_type diff_t;

        // Use a while loop for tail recursion elimination.
        while (true) {
            diff_t size = end - begin;

            // Insertion sort is faster for small arrays.
            if (size < insertion_sort_threshold) {
                if (leftmost) insertion_sort(begin, end, comp);
                else unguarded_insertion_sort(begin, end, comp);
                return;
            }

            // Choose pivot as median of 3 or pseudomedian of 9.
            diff_t s2 = size / 2;
            if (size > ninther_threshold) {
                sort3(begin, begin + s2, end - 1, comp);
                sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
                sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
                sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
                std::iter_swap(begin, begin + s2);
            } else sort3(begin + s2, begin, end - 1, comp);

            // If *(begin - 1) is the end of the right partition of a previous partition operation
            // there is no element in [begin, end) that is smaller than *(begin - 1). Then if our
            // pivot compares equal to *(begin - 1) we change strategy, putting equal elements in
            // the left partition, greater elements in the right partition. We do not have to
            // recurse on the left partition, since it's sorted (all equal).
            if (!leftmost && !comp(*(begin - 1), *begin)) {
                begin = partition_left(begin, end, comp) + 1;
                continue;
            }

            // Partition and get results.
            std::pair<Iter, bool> part_result =
                Branchless ? partition_right_branchless(begin, end, comp)
                           : partition_right(begin, end, comp);
            Iter pivot_pos = part_result.first;
            bool already_partitioned = part_result.second;

            // Check for a highly unbalanced partition.
            diff_t l_size = pivot_pos - begin;
            diff_t r_size = end - (pivot_pos + 1);
            bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

            // If we got a highly unbalanced partition we shuffle elements to break many patterns.
            if (highly_unbalanced) {
                // If we had too many bad partitions, switch to heapsort to guarantee O(n log n).
                if (--bad_allowed == 0) {
                    std::make_heap(begin, end, comp);
                    std::sort_heap(begin, end, comp);
                    return;
                }

                if (l_size >= insertion_sort_threshold) {
                    std::iter_swap(begin,             begin + l_size / 4);
                    std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);

                    if (l_size > ninther_threshold) {
                        std::iter_swap(begin + 1,         begin + (l_size / 4 + 1));
                        std::iter_swap(begin + 2,         begin + (l_size / 4 + 2));
                        std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
                        std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
                    }
                }
                
                if (r_size >= insertion_sort_threshold) {
                    std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
                    std::iter_swap(end - 1,                   end - r_size / 4);
                    
                    if (r_size > ninther_threshold) {
                        std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
                        std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
                        std::iter_swap(end - 2,             end - (1 + r_size / 4));
                        std::iter_swap(end - 3,             end - (2 + r_size / 4));
                    }
                }
            } else {
                // If we were decently balanced and we tried to sort an already partitioned
                // sequence try to use insertion sort.
                if (already_partitioned && partial_insertion_sort(begin, pivot_pos, comp)
                                        && partial_insertion_sort(pivot_pos + 1, end, comp)) return;
            }
                
            // Sort the left partition first using recursion and do tail recursion elimination for
            // the right-hand partition.
            pdqsort_loop<Iter, Compare, Branchless>(begin, pivot_pos, comp, bad_allowed, leftmost);
            begin = pivot_pos + 1;
            leftmost = false;
        }
    }